

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O1

void test_bin_ext(fitsfile *infits,FILE *out,FitsHdu *hduptr)

{
  int iVar1;
  FitsKey **ppFVar2;
  FitsKey *pFVar3;
  double dVar4;
  char **ppcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  ushort **ppuVar10;
  size_t sVar11;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  size_t sVar19;
  ushort **ppuVar20;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  void *pvVar25;
  int status;
  int datatype;
  int ntdim;
  long tdim [10];
  int local_b4;
  ushort **local_b0;
  int local_a4;
  ushort **local_a0;
  fitsfile *local_98;
  undefined1 local_8c [4];
  undefined1 local_88 [88];
  
  local_b4 = 0;
  ppFVar2 = hduptr->kwds;
  iVar1 = hduptr->tkeys;
  sVar19 = (size_t)iVar1;
  uVar17 = hduptr->ncols;
  local_98 = infits;
  test_ext(infits,out,hduptr);
  test_tbl(infits,out,hduptr);
  ppcVar5 = tmpkwds;
  builtin_strncpy(temp,"TNULL",6);
  ptemp = temp;
  pvVar9 = bsearch(&ptemp,tmpkwds,sVar19,8,compstrp);
  if (pvVar9 == (void *)0x0) {
    iVar8 = -99;
    iVar6 = -999;
  }
  else {
    uVar24 = (ulong)((long)pvVar9 - (long)ppcVar5) >> 3;
    iVar8 = (int)uVar24;
    if (iVar8 < 2) {
      uVar24 = 1;
    }
    else {
      uVar15 = 1;
      uVar22 = uVar24 & 0xffffffff;
      pvVar25 = pvVar9;
      do {
        iVar8 = (int)uVar22;
        pvVar25 = (void *)((long)pvVar25 + -8);
        iVar6 = compstrp(&ptemp,pvVar25);
        if (iVar6 != 0) {
          uVar24 = (ulong)uVar15;
          goto LAB_0010b276;
        }
        uVar22 = (ulong)(iVar8 - 1U);
        uVar15 = uVar15 + 1;
      } while (iVar8 - 1U != 1);
      iVar8 = 1;
    }
LAB_0010b276:
    iVar6 = (int)uVar24;
    if ((int)uVar24 + iVar8 < iVar1) {
      do {
        iVar23 = (int)uVar24;
        pvVar9 = (void *)((long)pvVar9 + 8);
        iVar7 = compstrp(&ptemp,pvVar9);
        iVar6 = iVar23;
        if (iVar7 != 0) break;
        uVar24 = (ulong)(iVar23 + 1);
        iVar6 = iVar1 - iVar8;
      } while (iVar23 + iVar8 + 1 < iVar1);
    }
  }
  if (0 < iVar6) {
    ppuVar10 = __ctype_b_loc();
    lVar18 = (long)iVar8;
    ppuVar20 = (ushort **)(long)(iVar6 + iVar8);
    local_b0 = ppuVar20;
    local_a0 = ppuVar10;
    do {
      pFVar3 = ppFVar2[lVar18];
      if ((*(byte *)((long)*ppuVar10 + (long)pFVar3->kname[5] * 2 + 1) & 8) != 0) {
        check_int(pFVar3,out);
        uVar24 = strtol(pFVar3->kname + 5,(char **)0x0,10);
        iVar6 = (int)uVar24;
        if ((int)uVar17 < iVar6 || iVar6 < 1) {
          sprintf(errmes,"Keyword #%d, %s: invalid index %d (> TFIELD = %d).",
                  (ulong)(uint)ppFVar2[lVar18]->kindex,ppFVar2[lVar18],uVar24 & 0xffffffff);
          wrterr(out,errmes,1);
          ppuVar10 = local_a0;
          ppuVar20 = local_b0;
        }
        else {
          uVar15 = iVar6 - 1;
          pcVar12 = tform[uVar15];
          pcVar13 = strchr(pcVar12,0x42);
          if ((((pcVar13 == (char *)0x0) && (pcVar13 = strchr(pcVar12,0x49), pcVar13 == (char *)0x0)
               ) && (pcVar13 = strchr(pcVar12,0x4a), pcVar13 == (char *)0x0)) &&
             (pcVar13 = strchr(pcVar12,0x4b), pcVar13 == (char *)0x0)) {
            sprintf(errmes,"Keyword #%d, %s is used for the column with format \"%s \".",
                    (ulong)(uint)ppFVar2[lVar18]->kindex,ppFVar2[lVar18],pcVar12);
            wrterr(out,errmes,2);
          }
          uVar24 = strtol(ppFVar2[lVar18]->kvalue,(char **)0x0,10);
          pcVar12 = strchr(tform[uVar15],0x42);
          if ((pcVar12 != (char *)0x0) && (0xff < uVar24)) {
            sprintf(errmes,"Keyword #%d, %s: The value %ld",(ulong)(uint)ppFVar2[lVar18]->kindex,
                    ppFVar2[lVar18],uVar24);
            sVar11 = strlen(errmes);
            builtin_strncpy(errmes + sVar11," is not ",8);
            builtin_strncpy(errmes + sVar11 + 8,"in the r",8);
            builtin_strncpy(errmes + sVar11 + 0x10,"ange of ",8);
            builtin_strncpy(errmes + sVar11 + 0x18,"datatype",8);
            builtin_strncpy(errmes + sVar11 + 0x20," B.",4);
            wrtwrn(out,errmes,0);
          }
          lVar14 = strtol(ppFVar2[lVar18]->kvalue,(char **)0x0,10);
          pcVar12 = strchr(tform[uVar15],0x49);
          ppuVar10 = local_a0;
          ppuVar20 = local_b0;
          if ((pcVar12 != (char *)0x0) && (lVar14 - 0x8000U < 0xffffffffffff0000)) {
            sprintf(errmes,"Keyword #%d, %s: The value %ld",(ulong)(uint)ppFVar2[lVar18]->kindex,
                    ppFVar2[lVar18],lVar14);
            sVar11 = strlen(errmes);
            builtin_strncpy(errmes + sVar11," is not ",8);
            builtin_strncpy(errmes + sVar11 + 8,"in the r",8);
            builtin_strncpy(errmes + sVar11 + 0x10,"ange of ",8);
            builtin_strncpy(errmes + sVar11 + 0x18,"datatype",8);
            builtin_strncpy(errmes + sVar11 + 0x20," I ",4);
            wrtwrn(out,errmes,0);
          }
        }
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < (long)ppuVar20);
  }
  ppcVar5 = tmpkwds;
  builtin_strncpy(temp,"TSCAL",6);
  ptemp = temp;
  pvVar9 = bsearch(&ptemp,tmpkwds,sVar19,8,compstrp);
  if (pvVar9 == (void *)0x0) {
    iVar8 = -99;
    iVar6 = -999;
  }
  else {
    uVar24 = (ulong)((long)pvVar9 - (long)ppcVar5) >> 3;
    iVar8 = (int)uVar24;
    if (iVar8 < 2) {
      uVar24 = 1;
    }
    else {
      uVar15 = 1;
      uVar22 = uVar24 & 0xffffffff;
      pvVar25 = pvVar9;
      do {
        iVar8 = (int)uVar22;
        pvVar25 = (void *)((long)pvVar25 + -8);
        iVar6 = compstrp(&ptemp,pvVar25);
        if (iVar6 != 0) {
          uVar24 = (ulong)uVar15;
          goto LAB_0010b638;
        }
        uVar22 = (ulong)(iVar8 - 1U);
        uVar15 = uVar15 + 1;
      } while (iVar8 - 1U != 1);
      iVar8 = 1;
    }
LAB_0010b638:
    iVar6 = (int)uVar24;
    if ((int)uVar24 + iVar8 < iVar1) {
      do {
        iVar23 = (int)uVar24;
        pvVar9 = (void *)((long)pvVar9 + 8);
        iVar7 = compstrp(&ptemp,pvVar9);
        iVar6 = iVar23;
        if (iVar7 != 0) break;
        uVar24 = (ulong)(iVar23 + 1);
        iVar6 = iVar1 - iVar8;
      } while (iVar23 + iVar8 + 1 < iVar1);
    }
  }
  if (0 < iVar6) {
    ppuVar20 = __ctype_b_loc();
    lVar18 = (long)iVar8;
    do {
      pFVar3 = ppFVar2[lVar18];
      if ((*(byte *)((long)*ppuVar20 + (long)pFVar3->kname[5] * 2 + 1) & 8) != 0) {
        iVar7 = check_flt(pFVar3,out);
        if (iVar7 != 0) {
          dVar4 = strtod(ppFVar2[lVar18]->kvalue,(char **)0x0);
          if ((dVar4 == 0.0) && (!NAN(dVar4))) {
            sprintf(errmes,"Keyword #%d, %s:",(ulong)(uint)ppFVar2[lVar18]->kindex);
            sVar11 = strlen(errmes);
            builtin_strncpy(errmes + sVar11,"The scal",8);
            builtin_strncpy(errmes + sVar11 + 8,"ing fact",8);
            builtin_strncpy(errmes + sVar11 + 0xc,"factor i",8);
            builtin_strncpy(errmes + sVar11 + 0x14,"s zero.",8);
            wrtwrn(out,errmes,0);
          }
        }
        uVar24 = strtol(pFVar3->kname + 5,(char **)0x0,10);
        iVar7 = (int)uVar24;
        if ((int)uVar17 < iVar7 || iVar7 < 1) {
          sprintf(errmes,"Keyword #%d, %s: invalid index %d (> TFIELD = %d).",
                  (ulong)(uint)ppFVar2[lVar18]->kindex,ppFVar2[lVar18],uVar24 & 0xffffffff);
        }
        else {
          pcVar12 = tform[iVar7 - 1];
          pcVar13 = strchr(pcVar12,0x41);
          if (((pcVar13 == (char *)0x0) && (pcVar13 = strchr(pcVar12,0x4c), pcVar13 == (char *)0x0))
             && (pcVar12 = strchr(pcVar12,0x58), pcVar12 == (char *)0x0)) goto LAB_0010b809;
          sprintf(errmes,"Keyword #%d, %s is used in A, L, or X column. ",
                  (ulong)(uint)ppFVar2[lVar18]->kindex);
        }
        wrterr(out,errmes,1);
      }
LAB_0010b809:
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar6 + iVar8);
  }
  ppcVar5 = tmpkwds;
  builtin_strncpy(temp,"TZERO",6);
  ptemp = temp;
  pvVar9 = bsearch(&ptemp,tmpkwds,sVar19,8,compstrp);
  if (pvVar9 == (void *)0x0) {
    iVar8 = -99;
    iVar6 = -999;
  }
  else {
    uVar24 = (ulong)((long)pvVar9 - (long)ppcVar5) >> 3;
    iVar8 = (int)uVar24;
    if (iVar8 < 2) {
      uVar24 = 1;
    }
    else {
      uVar15 = 1;
      uVar22 = uVar24 & 0xffffffff;
      pvVar25 = pvVar9;
      do {
        iVar8 = (int)uVar22;
        pvVar25 = (void *)((long)pvVar25 + -8);
        iVar6 = compstrp(&ptemp,pvVar25);
        if (iVar6 != 0) {
          uVar24 = (ulong)uVar15;
          goto LAB_0010b8d2;
        }
        uVar22 = (ulong)(iVar8 - 1U);
        uVar15 = uVar15 + 1;
      } while (iVar8 - 1U != 1);
      iVar8 = 1;
    }
LAB_0010b8d2:
    iVar6 = (int)uVar24;
    if (iVar8 + (int)uVar24 < iVar1) {
      do {
        iVar23 = (int)uVar24;
        pvVar9 = (void *)((long)pvVar9 + 8);
        iVar7 = compstrp(&ptemp,pvVar9);
        iVar6 = iVar23;
        if (iVar7 != 0) break;
        uVar24 = (ulong)(iVar23 + 1);
        iVar6 = iVar1 - iVar8;
      } while (iVar8 + iVar23 + 1 < iVar1);
    }
  }
  if (0 < iVar6) {
    ppuVar20 = __ctype_b_loc();
    lVar18 = (long)iVar8;
    do {
      pFVar3 = ppFVar2[lVar18];
      if ((*(byte *)((long)*ppuVar20 + (long)pFVar3->kname[5] * 2 + 1) & 8) != 0) {
        check_flt(pFVar3,out);
        uVar24 = strtol(pFVar3->kname + 5,(char **)0x0,10);
        iVar7 = (int)uVar24;
        if ((int)uVar17 < iVar7 || iVar7 < 1) {
          sprintf(errmes,"Keyword #%d, %s: invalid index %d (> TFIELD = %d).",
                  (ulong)(uint)ppFVar2[lVar18]->kindex,ppFVar2[lVar18],uVar24 & 0xffffffff);
        }
        else {
          pcVar12 = tform[iVar7 - 1];
          pcVar13 = strchr(pcVar12,0x41);
          if (((pcVar13 == (char *)0x0) || (pcVar13 = strchr(pcVar12,0x4c), pcVar13 == (char *)0x0))
             || (pcVar12 = strchr(pcVar12,0x58), pcVar12 == (char *)0x0)) goto LAB_0010ba2a;
          sprintf(errmes,"Keyword #%d, %s is used in A, L, or X column. ",
                  (ulong)(uint)ppFVar2[lVar18]->kindex);
        }
        wrterr(out,errmes,1);
      }
LAB_0010ba2a:
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar6 + iVar8);
  }
  hduptr->heap = (int)hduptr->naxes[1] * (int)*hduptr->naxes;
  ppcVar5 = tmpkwds;
  builtin_strncpy(temp,"THEAP",6);
  pvVar9 = bsearch(&ptemp,tmpkwds,sVar19,8,compstre);
  if (pvVar9 == (void *)0x0) {
    uVar15 = 0xffffff9d;
  }
  else {
    uVar24 = (ulong)((long)pvVar9 - (long)ppcVar5) >> 3;
    uVar21 = (uint)uVar24;
    if ((int)uVar21 < 2) {
      uVar15 = uVar21;
      uVar16 = 1;
    }
    else {
      uVar16 = 1;
      uVar24 = uVar24 & 0xffffffff;
      pvVar25 = pvVar9;
      do {
        uVar15 = (uint)uVar24;
        pvVar25 = (void *)((long)pvVar25 + -8);
        iVar6 = compstre(&ptemp,pvVar25);
        if (iVar6 != 0) goto LAB_0010baf9;
        uVar24 = (ulong)(uVar15 - 1);
        uVar16 = uVar16 + 1;
      } while (uVar15 - 1 != 1);
      uVar15 = 1;
      uVar16 = uVar21;
    }
LAB_0010baf9:
    if ((int)(uVar15 + uVar16) < iVar1) {
      iVar6 = uVar15 + uVar16;
      do {
        iVar6 = iVar6 + 1;
        pvVar9 = (void *)((long)pvVar9 + 8);
        iVar8 = compstre(&ptemp,pvVar9);
        if (iVar8 != 0) break;
      } while (iVar6 < iVar1);
    }
  }
  if (-1 < (int)uVar15) {
    iVar6 = check_int(ppFVar2[uVar15],out);
    if (iVar6 != 0) {
      lVar18 = strtol(hduptr->kwds[uVar15]->kvalue,(char **)0x0,10);
      hduptr->heap = (int)lVar18;
    }
    if (hduptr->pcount == 0) {
      sprintf(errmes,"Pcount is zero, but keyword THEAP is present at record #%d). ",
              (ulong)(uint)ppFVar2[uVar15]->kindex);
      wrterr(out,errmes,1);
    }
  }
  if (hduptr->pcount != 0) {
    uVar15 = 0;
    if (0 < (int)uVar17) {
      uVar15 = uVar17;
    }
    uVar21 = 0;
    do {
      if (uVar15 == uVar21) {
        sprintf(errmes,"PCOUNT = %ld, but there are no variable-length array columns.",
                hduptr->pcount);
        wrtwrn(out,errmes,0);
        break;
      }
      iVar6 = ffgtcl(local_98,uVar21 + 1,&local_a4,0,0,&local_b4);
      if (iVar6 != 0) {
        sprintf(errmes,"Column #%d: ",(ulong)uVar21);
        wrtferr(out,errmes,&local_b4,2);
      }
      uVar21 = uVar21 + 1;
    } while (-1 < local_a4);
  }
  ppcVar5 = tmpkwds;
  temp._4_2_ = temp._4_2_ & 0xff00;
  builtin_strncpy(temp,"TDIM",4);
  pvVar9 = bsearch(&ptemp,tmpkwds,sVar19,8,compstrp);
  if (pvVar9 == (void *)0x0) {
    iVar8 = -99;
    iVar6 = -999;
  }
  else {
    uVar24 = (ulong)((long)pvVar9 - (long)ppcVar5) >> 3;
    iVar8 = (int)uVar24;
    if (iVar8 < 2) {
      uVar24 = 1;
    }
    else {
      uVar15 = 1;
      uVar22 = uVar24 & 0xffffffff;
      pvVar25 = pvVar9;
      do {
        iVar8 = (int)uVar22;
        pvVar25 = (void *)((long)pvVar25 + -8);
        iVar6 = compstrp(&ptemp,pvVar25);
        if (iVar6 != 0) {
          uVar24 = (ulong)uVar15;
          goto LAB_0010bd1b;
        }
        uVar22 = (ulong)(iVar8 - 1U);
        uVar15 = uVar15 + 1;
      } while (iVar8 - 1U != 1);
      iVar8 = 1;
    }
LAB_0010bd1b:
    iVar6 = (int)uVar24;
    if ((int)uVar24 + iVar8 < iVar1) {
      do {
        iVar23 = (int)uVar24;
        pvVar9 = (void *)((long)pvVar9 + 8);
        iVar7 = compstrp(&ptemp,pvVar9);
        iVar6 = iVar23;
        if (iVar7 != 0) break;
        uVar24 = (ulong)(iVar23 + 1);
        iVar6 = iVar1 - iVar8;
      } while (iVar23 + iVar8 + 1 < iVar1);
    }
  }
  if (0 < iVar6) {
    ppuVar20 = __ctype_b_loc();
    lVar18 = (long)iVar8;
    local_b0 = ppuVar20;
    do {
      pFVar3 = ppFVar2[lVar18];
      if ((*(byte *)((long)*ppuVar20 + (long)pFVar3->kname[4] * 2 + 1) & 8) != 0) {
        check_str(pFVar3,out);
        if (pFVar3->kvalue[0] == ' ') {
          sprintf(errmes,"Keyword #%d, %s: TDIM=\"%s\" ",(ulong)(uint)pFVar3->kindex,pFVar3,
                  pFVar3->kvalue);
          sVar11 = strlen(errmes);
          builtin_strncpy(errmes + sVar11,"should n",8);
          builtin_strncpy(errmes + sVar11 + 8,"ot have ",8);
          builtin_strncpy(errmes + sVar11 + 0xf," leading",8);
          builtin_strncpy(errmes + sVar11 + 0x17," space.",8);
        }
        else {
          uVar24 = strtol(pFVar3->kname + 4,(char **)0x0,10);
          if ((int)uVar24 <= (int)uVar17 && 0 < (int)uVar24) {
            iVar7 = ffdtdm(local_98,pFVar3->kvalue,uVar24 & 0xffffffff,10,local_8c,local_88,
                           &local_b4);
            if (iVar7 != 0) {
              sprintf(errmes,"Keyword #%d, %s: ",(ulong)(uint)ppFVar2[lVar18]->kindex);
              ppuVar20 = local_b0;
              wrtferr(out,errmes,&local_b4,1);
            }
            goto LAB_0010be68;
          }
          sprintf(errmes,"Keyword #%d, %s: invalid index %d (> TFIELD = %d).",
                  (ulong)(uint)ppFVar2[lVar18]->kindex,ppFVar2[lVar18],uVar24 & 0xffffffff);
        }
        ppuVar20 = local_b0;
        wrterr(out,errmes,1);
      }
LAB_0010be68:
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar6 + iVar8);
  }
  if (0 < hduptr->ncols) {
    lVar18 = 0;
    do {
      pcVar12 = tform[lVar18];
      pcVar13 = strchr(pcVar12,0x41);
      if (pcVar13 != (char *)0x0) {
        uVar24 = strtol(pcVar12,(char **)0x0,10);
        ppuVar20 = __ctype_b_loc();
        if (((*(byte *)((long)*ppuVar20 + (long)pcVar13[1] * 2 + 1) & 8) != 0) &&
           (lVar14 = strtol(pcVar13 + 1,(char **)0x0,10),
           (int)((long)((ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 | uVar24 & 0xffffffff) %
                (long)(int)lVar14) != 0)) {
          sprintf(errmes,"TFORM %s of column %d: repeat %d is not the multiple of the width %d",
                  tform[lVar18],(ulong)((int)lVar18 + 1),uVar24 & 0xffffffff);
          wrtwrn(out,errmes,0);
        }
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < hduptr->ncols);
  }
  ppcVar5 = tmpkwds;
  builtin_strncpy(temp,"TBCOL",6);
  ptemp = temp;
  pvVar9 = bsearch(&ptemp,tmpkwds,sVar19,8,compstrp);
  if (pvVar9 == (void *)0x0) {
    uVar17 = 0xffffff9d;
    iVar6 = -999;
  }
  else {
    uVar24 = (ulong)((long)pvVar9 - (long)ppcVar5) >> 3;
    uVar17 = (uint)uVar24;
    if ((int)uVar17 < 2) {
      uVar24 = 1;
    }
    else {
      uVar15 = 1;
      uVar22 = uVar24 & 0xffffffff;
      pvVar25 = pvVar9;
      do {
        uVar17 = (uint)uVar22;
        pvVar25 = (void *)((long)pvVar25 + -8);
        iVar6 = compstrp(&ptemp,pvVar25);
        if (iVar6 != 0) {
          uVar24 = (ulong)uVar15;
          goto LAB_0010c066;
        }
        uVar22 = (ulong)(uVar17 - 1);
        uVar15 = uVar15 + 1;
      } while (uVar17 - 1 != 1);
      uVar17 = 1;
    }
LAB_0010c066:
    iVar6 = (int)uVar24;
    if ((int)(uVar17 + (int)uVar24) < iVar1) {
      do {
        iVar7 = (int)uVar24;
        pvVar9 = (void *)((long)pvVar9 + 8);
        iVar8 = compstrp(&ptemp,pvVar9);
        iVar6 = iVar7;
        if (iVar8 != 0) break;
        uVar24 = (ulong)(iVar7 + 1);
        iVar6 = iVar1 - uVar17;
      } while ((int)(uVar17 + iVar7 + 1) < iVar1);
    }
  }
  if ((-1 < (int)uVar17) && (0 < iVar6)) {
    ppuVar20 = __ctype_b_loc();
    uVar24 = (ulong)uVar17;
    do {
      pFVar3 = ppFVar2[uVar24];
      sVar19 = strlen(temp);
      if ((*(byte *)((long)*ppuVar20 + (long)pFVar3->kname[sVar19] * 2 + 1) & 8) != 0) {
        sprintf(errmes,"Keyword #%d, %s is not allowed in the Binary table.",
                (ulong)(uint)hduptr->kwds[uVar24]->kindex);
        wrterr(out,errmes,1);
      }
      uVar24 = uVar24 + 1;
    } while ((int)uVar24 < (int)(iVar6 + uVar17));
  }
  test_colnam(out,hduptr);
  return;
}

Assistant:

void test_bin_ext(fitsfile *infits, 	/* input fits file   */ 
	     FILE*     out,	/* output ascii file */
	     FitsHdu  *hduptr	/* information about header */
            )
{
    FitsKey *pkey;
    int i,j,k,n;
    long l;
    int status = 0;
    char *p;

    int ntdim;
    long tdim[10];
    int repeat, width;
    FitsKey **kwds;
    int numusrkey;
    int mcol, vla, datatype;

    /* The indexed keywords excluded from ascii table */
    char *exlkeys[] = { "TBCOL"}; 
    int nexlkeys = 1;

    kwds = hduptr->kwds;
    numusrkey = hduptr->tkeys;
    mcol = hduptr->ncols;

    /* General extension */ 
    test_ext(infits,out,hduptr);

    /* General table */ 
    test_tbl(infits,out,hduptr);

    /* The XTENSION, BITPIX, NAXIS, NAXISn, TFIELDS, PCOUNT, GCOUNT, TFORMn,  
       TTYPEn keywords  have been checked in CFITSIO */
    
    /*  Check TNULLn keywords */ 
    strcpy(temp,"TNULL");
    ptemp = temp;
    key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
    for (j = k; j< k + n ; j++){ 
	p = kwds[j]->kname; 
	p += 5;
        if(!isdigit((int)*p)) continue;
	check_int(kwds[j],out);
	i = (int) strtol(p,NULL,10) -1 ;
        if(i< 0 || i >= mcol) {
            sprintf(errmes,
      "Keyword #%d, %s: invalid index %d (> TFIELD = %d).", 
           kwds[j]->kindex,kwds[j]->kname,i+1,mcol); 
            wrterr(out,errmes,1);
            continue;
        }     
        if(strchr(tform[i],'B') == NULL &&  
           strchr(tform[i],'I') == NULL &&  
           strchr(tform[i],'J') == NULL &&  
           strchr(tform[i],'K') == NULL ) { 
            sprintf(errmes,
     "Keyword #%d, %s is used for the column with format \"%s \".", 
            kwds[j]->kindex,kwds[j]->kname,tform[i]); 
            wrterr(out,errmes,2); 
        } 
        l = strtol(kwds[j]->kvalue,NULL,10); 
        if(strchr(tform[i],'B') != NULL && (
            l < 0 || l > 255) ) {
            sprintf(errmes,"Keyword #%d, %s: The value %ld", 
            kwds[j]->kindex,kwds[j]->kname, l); 
            strcat(errmes, " is not in the range of datatype B.");
            wrtwrn(out,errmes,0); 
        }
        l = strtol(kwds[j]->kvalue,NULL,10); 
        if(strchr(tform[i],'I') != NULL && (
            l < -32768 || l > 32767) ) {
            sprintf(errmes,"Keyword #%d, %s: The value %ld", 
            kwds[j]->kindex,kwds[j]->kname, l); 
            strcat(errmes, " is not in the range of datatype I ");
            wrtwrn(out,errmes,0); 
        }
    } 
    
    /*  Check TSCALn keywords */ 
    strcpy(temp,"TSCAL");
    ptemp = temp;
    key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
    for (j = k; j< k + n ; j++){ 
	p = kwds[j]->kname; 
	p += 5;
        if(!isdigit((int)*p)) continue;
	if (check_flt(kwds[j],out) && strtod(kwds[j]->kvalue,NULL) == 0.0) { 
            sprintf(errmes,"Keyword #%d, %s:",
            kwds[j]->kindex,kwds[j]->kname);
            strcat(errmes,
              "The scaling factor is zero.");
            wrtwrn(out,errmes,0); 
        }
	i = (int) strtol(p,NULL,10) -1 ;
        if(i< 0 || i >= mcol) {
            sprintf(errmes,
      "Keyword #%d, %s: invalid index %d (> TFIELD = %d).", 
            kwds[j]->kindex,kwds[j]->kname,i+1,mcol); 
            wrterr(out,errmes,1);
            continue;
        }     
        if(strchr(tform[i],'A') != NULL ||  
           strchr(tform[i],'L') != NULL ||  
           strchr(tform[i],'X') != NULL ) { 
            sprintf(errmes,
         "Keyword #%d, %s is used in A, L, or X column. ",
            kwds[j]->kindex,kwds[j]->kname); 
            wrterr(out,errmes,1); 
        }
    } 

    /*  Check TZEROn keywords */ 
    strcpy(temp,"TZERO");
    ptemp = temp;
    key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
    for (j = k; j< k + n ; j++){ 
	p = kwds[j]->kname; 
	p += 5;
        if(!isdigit((int)*p)) continue;
	check_flt(kwds[j],out);
	i = (int) strtol(p,NULL,10) -1 ;
        if(i< 0 || i >= mcol) {
            sprintf(errmes,
      "Keyword #%d, %s: invalid index %d (> TFIELD = %d).", 
            kwds[j]->kindex,kwds[j]->kname,i+1,mcol); 
            wrterr(out,errmes,1);
            continue;
        }     
        if(strchr(tform[i],'A') != NULL &&  
           strchr(tform[i],'L') != NULL &&  
           strchr(tform[i],'X') != NULL ) { 
            sprintf(errmes,
                "Keyword #%d, %s is used in A, L, or X column. ",
            kwds[j]->kindex,kwds[j]->kname); 
            wrterr(out,errmes,1); 
        }
    } 

    /* Check THEAP keyword */   
    hduptr->heap = (hduptr->naxes[0]) * (hduptr->naxes[1]);
    strcpy(temp,"THEAP");
    key_match(tmpkwds,numusrkey,&ptemp,1,&k,&n);  
    if(k > -1) { 
         if(check_int(kwds[k],out))
             hduptr->heap = (int) strtol(hduptr->kwds[k]->kvalue,NULL,10);
         if(!hduptr->pcount) { 
            sprintf( errmes, 
               "Pcount is zero, but keyword THEAP is present at record #%d). ",
	        kwds[k]->kindex);
                wrterr(out,errmes,1); 
         }
    }

    /* if PCOUNT != 0, test that there is at least 1 variable length array column */
    vla = 0;
    if(hduptr->pcount) {
        for (i=0; i< mcol; i++){ 
            if(fits_get_coltype(infits, i+1, &datatype, NULL, NULL, &status)){ 
               sprintf(errmes,"Column #%d: ",i);
 	       wrtferr(out,errmes, &status,2);
            }
            if (datatype < 0) {
	      vla = 1;
	      break;
	    }
	}

	if (vla == 0) {
	    sprintf(errmes,
	    "PCOUNT = %ld, but there are no variable-length array columns.",
	   (long) hduptr->pcount);
            wrtwrn(out,errmes,0);
	} 
    }
      
   
    /* Check TDIMn  keywords */ 
    strcpy(temp,"TDIM");
    key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
    for (j = k; j< k + n ; j++){ 
        pkey = kwds[j]; 
	p = pkey->kname; 
	p += 4;
        if(!isdigit((int)*p)) continue;
	check_str(kwds[j],out);
        if(*(pkey->kvalue) == ' ') { 
            sprintf(errmes,"Keyword #%d, %s: TDIM=\"%s\" ", 
                pkey->kindex,pkey->kname,pkey->kvalue); 
            strcat(errmes,
                    "should not have leading space.");
            wrterr(out,errmes,1); 
            continue;
        }
	i = (int) strtol(p,NULL,10) -1 ;
        if(i< 0 || i >= mcol) {
            sprintf(errmes,
      "Keyword #%d, %s: invalid index %d (> TFIELD = %d).", 
            kwds[j]->kindex,kwds[j]->kname,i+1,mcol); 
            wrterr(out,errmes,1);
            continue;
        }     
	if(fits_decode_tdim(infits,pkey->kvalue,i+1,10,&ntdim,tdim, &status)){ 
           sprintf(errmes,"Keyword #%d, %s: ", 
                kwds[j]->kindex,kwds[j]->kname);
	    wrtferr(out,errmes,&status,1);
        } 
    } 

    /* check the local convension "rAw"*/
    for (i = 0; i < hduptr->ncols; i++) { 
	if((p = strchr(tform[i],'A'))==NULL) continue; 
        repeat = (int) strtol(tform[i],NULL,10);
        p++;
	if(!isdigit((int)*p))continue;
	width = (int)strtol(p,NULL,10);
	if(repeat%width != 0)  { 
	    sprintf(errmes,
	 "TFORM %s of column %d: repeat %d is not the multiple of the width %d",
	    tform[i], i+1, repeat, width);
            wrtwrn(out,errmes,0);
        } 
    }
   
    for (i = 0; i < nexlkeys; i++) {
        strcpy(temp,exlkeys[i]);
    	ptemp = temp;
    	key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
        if(k < 0) continue;
        for (j = k; j < k+n; j++) { 
            pkey = hduptr->kwds[j];

	    p = kwds[j]->kname; 
	    p += strlen(temp);
            if(!isdigit((int)*p)) continue;

            sprintf( errmes, 
               "Keyword #%d, %s is not allowed in the Binary table.",
               pkey->kindex,pkey->kname);
            wrterr(out,errmes,1);
        } 
    }
    
    /* check whether the column name is unique */
    test_colnam(out, hduptr);
    return ;
}